

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O2

uint64_t hpa_time_until_deferred_work(tsdn_t *tsdn,pai_t *self)

{
  _Bool _Var1;
  hpdata_t *phVar2;
  _func_uint64_t_tsdn_t_ptr_pai_t_ptr *p_Var3;
  _func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *p_Var4;
  ulong uVar5;
  long lVar6;
  hpa_shard_t *shard;
  ulong uVar7;
  nstime_t time_hugify_allowed;
  
  shard = (hpa_shard_t *)&self[1].alloc_batch;
  malloc_mutex_lock(tsdn,(malloc_mutex_t *)shard);
  phVar2 = duckdb_je_psset_pick_hugify((psset_t *)&self[5].dalloc_batch);
  if (phVar2 == (hpdata_t *)0x0) {
    uVar7 = 0xffffffffffffffff;
LAB_01f9caf5:
    _Var1 = hpa_should_purge((tsdn_t *)self,shard);
    if (_Var1) {
      if (self[0x65].shrink ==
          (_func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *)0x0)
      goto LAB_01f9cb38;
      p_Var4 = (_func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *)
               (**(code **)(self[1].alloc + 0xc0))(self + 0x66);
      lVar6 = (long)self[0x65].alloc - (long)p_Var4;
      if (self[0x65].alloc < p_Var4 || lVar6 == 0) {
        uVar7 = 0;
      }
      else {
        uVar5 = lVar6 * 1000000;
        if (uVar5 < uVar7) {
          uVar7 = uVar5;
        }
      }
    }
    *(undefined1 *)&self[2].expand = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&self[2].shrink);
  }
  else {
    p_Var3 = (_func_uint64_t_tsdn_t_ptr_pai_t_ptr *)(**(code **)(self[1].alloc + 0xc0))();
    lVar6 = (long)self[100].time_until_deferred_work - (long)p_Var3;
    if (p_Var3 <= self[100].time_until_deferred_work && lVar6 != 0) {
      uVar7 = lVar6 * 1000000;
      goto LAB_01f9caf5;
    }
LAB_01f9cb38:
    *(undefined1 *)&self[2].expand = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&self[2].shrink);
    uVar7 = 0;
  }
  return uVar7;
}

Assistant:

static uint64_t
hpa_time_until_deferred_work(tsdn_t *tsdn, pai_t *self) {
	hpa_shard_t *shard = hpa_from_pai(self);
	uint64_t time_ns = BACKGROUND_THREAD_DEFERRED_MAX;

	malloc_mutex_lock(tsdn, &shard->mtx);

	hpdata_t *to_hugify = psset_pick_hugify(&shard->psset);
	if (to_hugify != NULL) {
		nstime_t time_hugify_allowed =
		    hpdata_time_hugify_allowed(to_hugify);
		uint64_t since_hugify_allowed_ms =
		    shard->central->hooks.ms_since(&time_hugify_allowed);
		/*
		 * If not enough time has passed since hugification was allowed,
		 * sleep for the rest.
		 */
		if (since_hugify_allowed_ms < shard->opts.hugify_delay_ms) {
			time_ns = shard->opts.hugify_delay_ms -
			    since_hugify_allowed_ms;
			time_ns *= 1000 * 1000;
		} else {
			malloc_mutex_unlock(tsdn, &shard->mtx);
			return BACKGROUND_THREAD_DEFERRED_MIN;
		}
	}

	if (hpa_should_purge(tsdn, shard)) {
		/*
		 * If we haven't purged before, no need to check interval
		 * between purges. Simply purge as soon as possible.
		 */
		if (shard->stats.npurge_passes == 0) {
			malloc_mutex_unlock(tsdn, &shard->mtx);
			return BACKGROUND_THREAD_DEFERRED_MIN;
		}
		uint64_t since_last_purge_ms = shard->central->hooks.ms_since(
		    &shard->last_purge);

		if (since_last_purge_ms < shard->opts.min_purge_interval_ms) {
			uint64_t until_purge_ns;
			until_purge_ns = shard->opts.min_purge_interval_ms -
			    since_last_purge_ms;
			until_purge_ns *= 1000 * 1000;

			if (until_purge_ns < time_ns) {
				time_ns = until_purge_ns;
			}
		} else {
			time_ns = BACKGROUND_THREAD_DEFERRED_MIN;
		}
	}
	malloc_mutex_unlock(tsdn, &shard->mtx);
	return time_ns;
}